

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O1

void __thiscall
OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>::add
          (Accumulator<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *val)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  pdVar2 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pdVar2 == pdVar3) ||
     ((pdVar4 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,
      pdVar5 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, pdVar4 != pdVar5 &&
      ((long)pdVar3 - (long)pdVar2 != (long)pdVar4 - (long)pdVar5)))) {
    memcpy(&painCave,
           "Size of vector passed to add() did not match the size of the StaticAccumulator.",0x50);
    painCave.isFatal = 1;
    simError();
  }
  this->Count_ = this->Count_ + 1;
  if ((this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Val_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Total_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Avg_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->Avg2_,
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3);
  }
  pdVar2 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 3;
    pdVar3 = (this->Val_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->Total_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->Avg_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = ((double)CONCAT44(0x45300000,(int)(this->Count_ >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->Count_) - 4503599627370496.0);
    pdVar6 = (this->Avg2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      dVar1 = pdVar2[lVar8];
      if ((dVar1 != 1.79769313486232e+308) || (NAN(dVar1))) {
        pdVar3[lVar8] = dVar1;
        pdVar4[lVar8] = pdVar2[lVar8] + pdVar4[lVar8];
        dVar1 = pdVar5[lVar8];
        pdVar5[lVar8] = (pdVar2[lVar8] - dVar1) / dVar9 + dVar1;
        dVar1 = pdVar6[lVar8];
        pdVar6[lVar8] = (pdVar2[lVar8] * pdVar2[lVar8] - dVar1) / dVar9 + dVar1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  return;
}

Assistant:

void add(const std::vector<RealType>& val) {
      if (val.empty() || (val.size() != Avg_.size() && !Avg_.empty())) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Size of vector passed to add() did not "
                 "match the size of the StaticAccumulator.");
        painCave.isFatal = 1;
        simError();
      }

      Count_++;

      if (Avg_.empty()) {
        Val_.resize(val.size());
        Total_.resize(val.size());
        Avg_.resize(val.size());
        Avg2_.resize(val.size());
      }

      for (std::size_t i = 0; i < val.size(); i++) {
        /* If our placeholder, BinEmptyFlag, is passed to add(), we should
            not record data at the current index */
        if (val[i] == BinEmptyFlag) continue;
        Val_[i] = val[i];
        Total_[i] += val[i];
        Avg_[i] += (val[i] - Avg_[i]) / static_cast<RealType>(Count_);
        Avg2_[i] +=
            (val[i] * val[i] - Avg2_[i]) / static_cast<RealType>(Count_);
      }
    }